

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_265da4::SndioCapture::open(SndioCapture *this,char *__file,int __oflag,...)

{
  DevFmtType DVar1;
  ALCdevice *pAVar2;
  atomic<unsigned_long> __p;
  int iVar3;
  ALuint AVar4;
  backend_exception *pbVar5;
  sio_hdl *psVar6;
  ALCchar *pAVar7;
  ALCchar *pAVar8;
  sio_par par;
  __atomic_base<unsigned_long> local_28;
  
  if ((__file != (char *)0x0) && (iVar3 = strcmp(__file,"SndIO Default"), iVar3 != 0)) {
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(pbVar5,0xa004,"Device name \"%s\" not found",__file);
    __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
  }
  psVar6 = (sio_hdl *)sio_open(0,2,0);
  this->mSndHandle = psVar6;
  if (psVar6 == (sio_hdl *)0x0) {
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(pbVar5,0xa004,"Could not open backend device");
    goto LAB_0015f0b0;
  }
  sio_initpar(&par);
  pAVar2 = (this->super_BackendBase).mDevice;
  switch(pAVar2->FmtType) {
  case DevFmtByte:
    par.bps = 1;
    par.sig = 1;
    break;
  case DevFmtUByte:
    par.bps = 1;
    par.sig = 0;
    break;
  case DevFmtShort:
    par.bps = 2;
    par.sig = 1;
    goto LAB_0015edf3;
  case DevFmtUShort:
    par.bps = 2;
    par.sig = 0;
LAB_0015edf3:
    par.bits = 0x10;
    goto LAB_0015ee10;
  case DevFmtInt:
    par.bps = 4;
    par.sig = 1;
    goto LAB_0015ee0d;
  case DevFmtUInt:
    par.bps = 4;
    par.sig = 0;
LAB_0015ee0d:
    par.bits = 0x20;
    goto LAB_0015ee10;
  case DevFmtFloat:
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    pAVar7 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
    al::backend_exception::backend_exception
              (pbVar5,0xa004,"%s capture samples not supported",pAVar7);
    goto LAB_0015f0b0;
  default:
    par.bits = par.bps << 3;
    goto LAB_0015ee10;
  }
  par.bits = 8;
LAB_0015ee10:
  par.le = 1;
  par.msb = 0;
  par.rchan = ALCdevice::channelsFromFmt(pAVar2);
  pAVar2 = (this->super_BackendBase).mDevice;
  par.rate = pAVar2->Frequency;
  par.appbufsz = par.rate / 10;
  if (par.rate / 10 < pAVar2->BufferSize) {
    par.appbufsz = pAVar2->BufferSize;
  }
  par.round = par.rate / 0x28;
  if (par.appbufsz < par.rate / 0x28) {
    par.round = par.appbufsz;
  }
  pAVar2->UpdateSize = par.round;
  pAVar2->BufferSize = par.appbufsz;
  iVar3 = sio_setpar(this->mSndHandle,&par,(ulong)par.rate % 0x28);
  if ((iVar3 == 0) || (iVar3 = sio_getpar(this->mSndHandle,&par), iVar3 == 0)) {
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(pbVar5,0xa004,"Failed to set device praameters");
  }
  else if (par.bits == par.bps << 3) {
    pAVar2 = (this->super_BackendBase).mDevice;
    DVar1 = pAVar2->FmtType;
    if (((((((par.bits == 8 && DVar1 == DevFmtByte) && par.sig != 0) ||
           ((DVar1 == DevFmtUByte && par.bits == 8) && par.sig == 0)) ||
          ((par.bits == 0x10 && DVar1 == DevFmtShort) && par.sig != 0)) ||
         (((DVar1 == DevFmtUShort && par.bits == 0x10) && par.sig == 0 ||
          ((par.bits == 0x20 && DVar1 == DevFmtInt) && par.sig != 0)))) ||
        ((par.bits == 0x20 && ((DVar1 == DevFmtUInt && (par.sig == 0)))))) &&
       ((AVar4 = ALCdevice::channelsFromFmt(pAVar2), AVar4 == par.rchan &&
        (pAVar2 = (this->super_BackendBase).mDevice, pAVar2->Frequency == par.rate)))) {
      RingBuffer::Create((RingBuffer *)&stack0xffffffffffffffd8,(ulong)pAVar2->BufferSize,
                         (ulong)(AVar4 * par.bps),0);
      __p.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_28._M_i;
      local_28._M_i = 0;
      std::__uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>::reset
                ((__uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_> *)&this->mRing,
                 (pointer)__p.super___atomic_base<unsigned_long>._M_i);
      std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::~unique_ptr
                ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)
                 &stack0xffffffffffffffd8);
      BackendBase::setDefaultChannelOrder(&this->super_BackendBase);
      iVar3 = std::__cxx11::string::assign((char *)&((this->super_BackendBase).mDevice)->DeviceName)
      ;
      return iVar3;
    }
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    pAVar7 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
    pAVar8 = DevFmtChannelsString(((this->super_BackendBase).mDevice)->FmtChans);
    al::backend_exception::backend_exception
              (pbVar5,0xa004,"Failed to set format %s %s %uhz, got %c%u %u-channel %uhz instead",
               pAVar7,pAVar8,(ulong)((this->super_BackendBase).mDevice)->Frequency,
               (ulong)((uint)(par.sig == 0) * 2 + 0x73),(ulong)par.bits,(ulong)par.rchan,
               (ulong)par.rate);
  }
  else {
    pbVar5 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception
              (pbVar5,0xa004,"Padded samples not supported (got %u of %u bits)",(ulong)par.bits,
               (ulong)(par.bps << 3));
  }
LAB_0015f0b0:
  __cxa_throw(pbVar5,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void SndioCapture::open(const ALCchar *name)
{
    if(!name)
        name = sndio_device;
    else if(strcmp(name, sndio_device) != 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};

    mSndHandle = sio_open(nullptr, SIO_REC, 0);
    if(mSndHandle == nullptr)
        throw al::backend_exception{ALC_INVALID_VALUE, "Could not open backend device"};

    sio_par par;
    sio_initpar(&par);

    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        par.bps = 1;
        par.sig = 1;
        break;
    case DevFmtUByte:
        par.bps = 1;
        par.sig = 0;
        break;
    case DevFmtShort:
        par.bps = 2;
        par.sig = 1;
        break;
    case DevFmtUShort:
        par.bps = 2;
        par.sig = 0;
        break;
    case DevFmtInt:
        par.bps = 4;
        par.sig = 1;
        break;
    case DevFmtUInt:
        par.bps = 4;
        par.sig = 0;
        break;
    case DevFmtFloat:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture samples not supported",
            DevFmtTypeString(mDevice->FmtType)};
    }
    par.bits = par.bps * 8;
    par.le = SIO_LE_NATIVE;
    par.msb = SIO_LE_NATIVE ? 0 : 1;
    par.rchan = mDevice->channelsFromFmt();
    par.rate = mDevice->Frequency;

    par.appbufsz = maxu(mDevice->BufferSize, mDevice->Frequency/10);
    par.round = minu(par.appbufsz, mDevice->Frequency/40);

    mDevice->UpdateSize = par.round;
    mDevice->BufferSize = par.appbufsz;

    if(!sio_setpar(mSndHandle, &par) || !sio_getpar(mSndHandle, &par))
        throw al::backend_exception{ALC_INVALID_VALUE, "Failed to set device praameters"};

    if(par.bits != par.bps*8)
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Padded samples not supported (got %u of %u bits)", par.bits, par.bps*8};

    if(!((mDevice->FmtType == DevFmtByte && par.bits == 8 && par.sig != 0)
        || (mDevice->FmtType == DevFmtUByte && par.bits == 8 && par.sig == 0)
        || (mDevice->FmtType == DevFmtShort && par.bits == 16 && par.sig != 0)
        || (mDevice->FmtType == DevFmtUShort && par.bits == 16 && par.sig == 0)
        || (mDevice->FmtType == DevFmtInt && par.bits == 32 && par.sig != 0)
        || (mDevice->FmtType == DevFmtUInt && par.bits == 32 && par.sig == 0))
        || mDevice->channelsFromFmt() != par.rchan || mDevice->Frequency != par.rate)
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Failed to set format %s %s %uhz, got %c%u %u-channel %uhz instead",
            DevFmtTypeString(mDevice->FmtType), DevFmtChannelsString(mDevice->FmtChans),
            mDevice->Frequency, par.sig?'s':'u', par.bits, par.rchan, par.rate};

    mRing = RingBuffer::Create(mDevice->BufferSize, par.bps*par.rchan, false);

    setDefaultChannelOrder();

    mDevice->DeviceName = name;
}